

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O2

void __thiscall PDA::Utils::Settings::initParams(Settings *this,int argc,char **argv)

{
  __type _Var1;
  ParamsException *pPVar2;
  InformationException *pIVar3;
  int iVar4;
  wstring local_10b0;
  wstring currentParam;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1058;
  wchar_t buf [1025];
  
  this->m_advancedEnable = false;
  this->m_syntaxTraceEnable = false;
  this->m_isVersion = false;
  this->m_isHelp = false;
  std::__cxx11::wstring::assign((wchar_t *)&this->m_outputFilePath);
  iVar4 = 1;
  do {
    if (argc <= iVar4) {
      if (this->m_isHelp != false) {
        pIVar3 = (InformationException *)__cxa_allocate_exception(0x28);
        Exception::InformationException::InformationException
                  (pIVar3,(wstring *)Constants::helpText_abi_cxx11_);
        __cxa_throw(pIVar3,&Exception::InformationException::typeinfo,
                    Exception::Exception::~Exception);
      }
      if (this->m_isVersion != true) {
        if ((this->m_sourceFilePath)._M_string_length != 0) {
          return;
        }
        pPVar2 = (ParamsException *)__cxa_allocate_exception(0x28);
        std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                  ((wstring *)buf,L"No source file",(allocator<wchar_t> *)&currentParam);
        Exception::ParamsException::ParamsException(pPVar2,(wstring *)buf);
        __cxa_throw(pPVar2,&Exception::ParamsException::typeinfo,Exception::Exception::~Exception);
      }
      pIVar3 = (InformationException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_1058,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     Constants::applicationName_abi_cxx11_,L' ');
      std::operator+(&local_10b0,&local_1058,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     Constants::applicationVersion_abi_cxx11_);
      std::operator+(&currentParam,&local_10b0,L'\n');
      std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     buf,&currentParam,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     Constants::organizationName_abi_cxx11_);
      Exception::InformationException::InformationException(pIVar3,(wstring *)buf);
      __cxa_throw(pIVar3,&Exception::InformationException::typeinfo,Exception::Exception::~Exception
                 );
    }
    currentParam._M_dataplus._M_p = (pointer)&currentParam.field_2;
    currentParam._M_string_length = 0;
    currentParam.field_2._M_local_buf[0] = L'\0';
    mbstowcs(buf,argv[iVar4],0x400);
    std::__cxx11::wstring::assign((wchar_t *)&currentParam);
    _Var1 = std::operator==(&currentParam,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)Constants::helpArgumentLong_abi_cxx11_);
    if (_Var1) {
LAB_00124383:
      this->m_isHelp = true;
    }
    else {
      _Var1 = std::operator==(&currentParam,
                              (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)Constants::helpArgumentShort_abi_cxx11_);
      if (_Var1) goto LAB_00124383;
      _Var1 = std::operator==(&currentParam,
                              (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)Constants::versionArgumentLong_abi_cxx11_);
      if (_Var1) {
LAB_001243bd:
        this->m_isVersion = true;
      }
      else {
        _Var1 = std::operator==(&currentParam,
                                (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)Constants::versionArgumentShort_abi_cxx11_);
        if (_Var1) goto LAB_001243bd;
        _Var1 = std::operator==(&currentParam,
                                (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)Constants::sourceFilePathArgumentLong_abi_cxx11_);
        if (_Var1) {
LAB_001243ec:
          iVar4 = iVar4 + 1;
          if (argc <= iVar4) {
            pPVar2 = (ParamsException *)__cxa_allocate_exception(0x28);
            std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                      ((wstring *)&local_10b0,L"Key -S (--source) used but without argument",
                       (allocator<wchar_t> *)&local_1058);
            Exception::ParamsException::ParamsException(pPVar2,&local_10b0);
            __cxa_throw(pPVar2,&Exception::ParamsException::typeinfo,
                        Exception::Exception::~Exception);
          }
          mbstowcs(buf,argv[iVar4],0x400);
          std::__cxx11::wstring::assign((wchar_t *)&this->m_sourceFilePath);
        }
        else {
          _Var1 = std::operator==(&currentParam,
                                  (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                   *)Constants::sourceFilePathArgumentShort_abi_cxx11_);
          if (_Var1) goto LAB_001243ec;
          _Var1 = std::operator==(&currentParam,
                                  (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                   *)Constants::traceArgumentShort_abi_cxx11_);
          if (_Var1) {
LAB_00124444:
            this->m_syntaxTraceEnable = true;
          }
          else {
            _Var1 = std::operator==(&currentParam,
                                    (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                     *)Constants::traceArgumentLong_abi_cxx11_);
            if (_Var1) goto LAB_00124444;
            _Var1 = std::operator==(&currentParam,
                                    (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                     *)Constants::advancedLogLong_abi_cxx11_);
            if (_Var1) {
LAB_00124476:
              this->m_advancedEnable = true;
            }
            else {
              _Var1 = std::operator==(&currentParam,
                                      (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                       *)Constants::advancedLogShort_abi_cxx11_);
              if (_Var1) goto LAB_00124476;
              _Var1 = std::operator==(&currentParam,
                                      (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                       *)Constants::outputPathArgumentLong_abi_cxx11_);
              if (_Var1) {
LAB_001244a8:
                iVar4 = iVar4 + 1;
                if (argc <= iVar4) {
                  pPVar2 = (ParamsException *)__cxa_allocate_exception(0x28);
                  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                            ((wstring *)&local_10b0,L"Key -O (--output) used but without argument",
                             (allocator<wchar_t> *)&local_1058);
                  Exception::ParamsException::ParamsException(pPVar2,&local_10b0);
                  __cxa_throw(pPVar2,&Exception::ParamsException::typeinfo,
                              Exception::Exception::~Exception);
                }
                mbstowcs(buf,argv[iVar4],0x400);
                std::__cxx11::wstring::assign((wchar_t *)&this->m_outputFilePath);
              }
              else {
                _Var1 = std::operator==(&currentParam,
                                        (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                         *)Constants::outputPathArgumentShort_abi_cxx11_);
                if (_Var1) goto LAB_001244a8;
                _Var1 = std::operator==(&currentParam,
                                        (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                         *)Constants::includePathArgumentLong_abi_cxx11_);
                if (_Var1) {
LAB_00124500:
                  iVar4 = iVar4 + 1;
                  if (argc <= iVar4) {
                    pPVar2 = (ParamsException *)__cxa_allocate_exception(0x28);
                    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                              ((wstring *)&local_10b0,
                               L"Key -I (--include) used but without argument",
                               (allocator<wchar_t> *)&local_1058);
                    Exception::ParamsException::ParamsException(pPVar2,&local_10b0);
                    __cxa_throw(pPVar2,&Exception::ParamsException::typeinfo,
                                Exception::Exception::~Exception);
                  }
                  mbstowcs(buf,argv[iVar4],0x400);
                  std::__cxx11::wstring::assign((wchar_t *)&this->m_includeFilePath);
                }
                else {
                  _Var1 = std::operator==(&currentParam,
                                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                           *)Constants::includePathArgumentShort_abi_cxx11_);
                  if (_Var1) goto LAB_00124500;
                  _Var1 = std::operator==(&currentParam,
                                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                           *)Constants::logFilePathArgumentLong_abi_cxx11_);
                  if (!_Var1) {
                    std::operator==(&currentParam,
                                    (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                     *)Constants::logFilePathArgumentShort_abi_cxx11_);
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::wstring::~wstring((wstring *)&currentParam);
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void Settings::initParams(int argc, char **argv)
{
    m_isHelp = false;
    m_isVersion = false;
    m_syntaxTraceEnable = false;
    m_advancedEnable = false;
    m_outputFilePath = L"result.s";

    for(int i = 1 ; i < argc; ++i)
    {
        wchar_t buf[PARAM_BUFFER_SIZE + 1];
        std::wstring currentParam;
        mbstowcs(buf, argv[i], PARAM_BUFFER_SIZE);
        currentParam = buf;
        if (currentParam == Constants::helpArgumentLong || currentParam == Constants::helpArgumentShort)
        {
            m_isHelp = true;
        }
        else if (currentParam == Constants::versionArgumentLong || currentParam == Constants::versionArgumentShort)
        {
            m_isVersion = true;
        }
        else if (currentParam == Constants::sourceFilePathArgumentLong || currentParam == Constants::sourceFilePathArgumentShort)
        {
            if (++i < argc)
            {
                mbstowcs(buf, argv[i], PARAM_BUFFER_SIZE);
                m_sourceFilePath = buf;
            }
            else
            {
                throw Exception::ParamsException( L"Key -S (--source) used but without argument" );
            }
        }
        else if (currentParam == Constants::traceArgumentShort || currentParam == Constants::traceArgumentLong)
        {
            m_syntaxTraceEnable = true;
        }
        else if (currentParam == Constants::advancedLogLong || currentParam == Constants::advancedLogShort)
        {
            m_advancedEnable = true;
        }
        else if (currentParam == Constants::outputPathArgumentLong || currentParam == Constants::outputPathArgumentShort)
        {
            if (++i < argc)
            {
                mbstowcs(buf, argv[i], PARAM_BUFFER_SIZE);
                m_outputFilePath = buf;
            }
            else
            {
                throw Exception::ParamsException( L"Key -O (--output) used but without argument" );
            }
        }
        else if (currentParam == Constants::includePathArgumentLong || currentParam == Constants::includePathArgumentShort)
        {
            if (++i < argc)
            {
                mbstowcs(buf, argv[i], PARAM_BUFFER_SIZE);
                m_includeFilePath = buf;
            }
            else
            {
                throw Exception::ParamsException( L"Key -I (--include) used but without argument" );
            }
        }
        else if (currentParam == Constants::logFilePathArgumentLong || currentParam == Constants::logFilePathArgumentShort)
        {

        }
    }
    if (m_isHelp)
    {
        throw Exception::InformationException(Constants::helpText);
    }
    else if (m_isVersion)
    {
        throw Exception::InformationException(Constants::applicationName + L' ' + Constants::applicationVersion + L'\n' + Constants::organizationName);
    }
    else if (m_sourceFilePath.empty())
    {
        throw Exception::ParamsException( L"No source file" );
    }
}